

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UILighting.cpp
# Opt level: O2

void UI::LightingLoadEnvMapModal
               (shared_ptr<myvk::CommandPool> *command_pool,shared_ptr<Lighting> *lighting)

{
  bool bVar1;
  ImGuiStyle *pIVar2;
  float fVar3;
  ImVec2 local_30;
  char *kFilter [2];
  
  ImGui::SetNextWindowCentering();
  bVar1 = ImGui::BeginPopupModal("Load Environment Map",(bool *)0x0,0x45);
  if (bVar1) {
    kFilter[0] = "*.hdr";
    kFilter[1] = "*.exr";
    ImGui::FileOpen("Env Map Filename","...",LightingLoadEnvMapModal::name_buf,0x200,
                    "Environment Map Filename",2,kFilter);
    fVar3 = ImGui::GetWindowContentRegionWidth();
    pIVar2 = ImGui::GetStyle();
    fVar3 = (fVar3 - (pIVar2->ItemSpacing).x) * 0.5;
    local_30.y = 0.0;
    local_30.x = fVar3;
    bVar1 = ImGui::Button("Load",&local_30);
    if (bVar1) {
      myvk::Queue::WaitIdle
                ((((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->m_queue_ptr).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      EnvironmentMap::Reset
                ((((lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 m_environment_map_ptr).
                 super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr,command_pool,
                 LightingLoadEnvMapModal::name_buf);
      ImGui::CloseCurrentPopup();
    }
    ImGui::SetItemDefaultFocus();
    ImGui::SameLine(0.0,-1.0);
    local_30.y = 0.0;
    local_30.x = fVar3;
    bVar1 = ImGui::Button("Cancel",&local_30);
    if (bVar1) {
      ImGui::CloseCurrentPopup();
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void LightingLoadEnvMapModal(const std::shared_ptr<myvk::CommandPool> &command_pool,
                             const std::shared_ptr<Lighting> &lighting) {
	ImGui::SetNextWindowCentering();
	if (ImGui::BeginPopupModal(kLightingLoadEnvMapModal, nullptr,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar |
	                               ImGuiWindowFlags_NoMove)) {
		static char name_buf[kFilenameBufSize];

		constexpr const char *kFilter[] = {"*.hdr", "*.exr"};

		ImGui::FileOpen("Env Map Filename", "...", name_buf, kFilenameBufSize, "Environment Map Filename", 2, kFilter);

		float button_width = (ImGui::GetWindowContentRegionWidth() - ImGui::GetStyle().ItemSpacing.x) * 0.5f;

		if (ImGui::Button("Load", {button_width, 0})) {
			command_pool->GetQueuePtr()->WaitIdle();
			lighting->GetEnvironmentMapPtr()->Reset(command_pool, name_buf);
			ImGui::CloseCurrentPopup();
		}
		ImGui::SetItemDefaultFocus();
		ImGui::SameLine();
		if (ImGui::Button("Cancel", {button_width, 0}))
			ImGui::CloseCurrentPopup();

		ImGui::EndPopup();
	}
}